

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

void __thiscall QFont::setPointSize(QFont *this,int pointSize)

{
  QFontPrivate *pQVar1;
  uint in_ESI;
  QFont *in_RDI;
  long in_FS_OFFSET;
  double dVar2;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  QFont *this_00;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)in_ESI < 1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),
               (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffb8);
    QMessageLogger::warning
              (local_28,"QFont::setPointSize: Point size <= 0 (%d), must be greater than 0",
               (ulong)in_ESI);
  }
  else {
    this_00 = in_RDI;
    if (((ulong)*(char **)&in_RDI->resolve_mask & 2) != 0) {
      pQVar1 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QFontPrivate> *)0x711f09);
      dVar2 = (pQVar1->request).pointSize;
      if ((dVar2 == (double)(int)in_ESI) && (!NAN(dVar2) && !NAN((double)(int)in_ESI)))
      goto LAB_00711f6f;
    }
    detach(this_00);
    dVar2 = (double)(int)in_ESI;
    pQVar1 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x711f3d);
    (pQVar1->request).pointSize = dVar2;
    pQVar1 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x711f51);
    (pQVar1->request).pixelSize = -1.0;
    in_RDI->resolve_mask = in_RDI->resolve_mask | 2;
  }
LAB_00711f6f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFont::setPointSize(int pointSize)
{
    if (pointSize <= 0) {
        qWarning("QFont::setPointSize: Point size <= 0 (%d), must be greater than 0", pointSize);
        return;
    }

    if ((resolve_mask & QFont::SizeResolved) && d->request.pointSize == qreal(pointSize))
        return;

    detach();

    d->request.pointSize = qreal(pointSize);
    d->request.pixelSize = -1;

    resolve_mask |= QFont::SizeResolved;
}